

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

void ffcfmt(char *tform,char *cform)

{
  bool bVar1;
  char cVar2;
  ushort uVar3;
  uint uVar4;
  ushort **ppuVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  
  *cform = '\0';
  for (uVar8 = 0; (byte)tform[uVar8] == 0x20; uVar8 = uVar8 + 1) {
  }
  uVar4 = (byte)tform[uVar8] - 0x41;
  if ((uVar4 < 9) && ((0x139U >> (uVar4 & 0x1f) & 1) != 0)) {
    pcVar7 = tform + (uVar8 & 0xffffffff);
    bVar1 = false;
    do {
      pcVar7 = pcVar7 + 1;
      cVar2 = *pcVar7;
      if (cVar2 == '.') {
        uVar3 = (ushort)!bVar1;
        bVar1 = true;
      }
      else {
        if (cVar2 == '\0') {
          *cform = '%';
          strcpy(cform + 1,tform + (uVar8 + 1 & 0xffffffff));
          cVar2 = tform[uVar8];
          if (cVar2 == 'I') {
            sVar6 = strlen(cform);
            builtin_strncpy(cform + sVar6,".0f",4);
          }
          else {
            if (cVar2 != 'A') goto LAB_00143639;
            sVar6 = strlen(cform);
            (cform + sVar6)[0] = 's';
            (cform + sVar6)[1] = '\0';
          }
          cVar2 = tform[uVar8];
LAB_00143639:
          if (cVar2 == 'F') {
            sVar6 = strlen(cform);
            (cform + sVar6)[0] = 'f';
            (cform + sVar6)[1] = '\0';
            cVar2 = tform[uVar8];
          }
          if (cVar2 == 'E') {
            sVar6 = strlen(cform);
            (cform + sVar6)[0] = 'E';
            (cform + sVar6)[1] = '\0';
            cVar2 = tform[uVar8];
          }
          if (cVar2 != 'D') {
            return;
          }
          sVar6 = strlen(cform);
          (cform + sVar6)[0] = 'E';
          (cform + sVar6)[1] = '\0';
          return;
        }
        ppuVar5 = __ctype_b_loc();
        uVar3 = (*ppuVar5)[cVar2] >> 0xb & 1;
      }
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void ffcfmt(char *tform,    /* value of an ASCII table TFORMn keyword */
            char *cform)    /* equivalent format code in C language syntax */
/*
  convert the FITS format string for an ASCII Table extension column into the
  equivalent C format string that can be used in a printf statement, after
  the values have been read as a double.
*/
{
    int ii, istart, isgood, npt;
    
    cform[0] = '\0';
    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (tform[ii] == 0)
        return;    /* input format string was blank */
    istart = ii;
    
    isgood = 1;
    npt = 0;
    if (tform[ii] != 'A' && tform[ii] != 'I' && tform[ii] != 'F'
                 && tform[ii] != 'E' && tform[ii] != 'D')
       isgood = 0;
    ii++;
    while (isgood && tform[ii] != 0)
    {
       /* one period is allowed */
       if (tform[ii] == '.')
       {
          if (npt > 0)
            isgood = 0;
          else
            ++npt; 
       }
       else if (!isdigit(tform[ii]))
          isgood = 0;
       ++ii; 
    }
    if (!isgood)
       return;

    cform[0] = '%';  /* start the format string */

    strcpy(&cform[1], &tform[istart + 1]); /* append the width and decimal code */


    if (tform[istart] == 'A')
        strcat(cform, "s");
    else if (tform[istart] == 'I')
        strcat(cform, ".0f");  /*  0 precision to suppress decimal point */
    if (tform[istart] == 'F')
        strcat(cform, "f");
    if (tform[istart] == 'E')
        strcat(cform, "E");
    if (tform[istart] == 'D')
        strcat(cform, "E");

    return;
}